

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O0

void __thiscall
binlog::SessionWriter::SessionWriter
          (SessionWriter *this,Session *session,size_t queueCapacity,uint64_t id,string *name)

{
  ulong uVar1;
  long in_RCX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  Queue *in_stack_ffffffffffffff38;
  SessionWriter *this_00;
  string local_88 [16];
  WriterProp *in_stack_ffffffffffffff88;
  SessionWriter *in_stack_ffffffffffffff90;
  Session *in_stack_ffffffffffffff98;
  string local_50 [32];
  undefined8 local_30;
  long local_20;
  
  *in_RDI = in_RSI;
  local_20 = in_RCX;
  std::__cxx11::string::string(local_50);
  local_30 = 0;
  Session::createChannel
            (in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  WriterProp::~WriterProp((WriterProp *)0x106b13);
  this_00 = (SessionWriter *)(in_RDI + 3);
  std::__shared_ptr_access<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x106b2d);
  Session::Channel::queue((Channel *)0x106b35);
  detail::QueueWriter::QueueWriter((QueueWriter *)this_00,in_stack_ffffffffffffff38);
  if (local_20 != 0) {
    setId(this_00,(uint64_t)in_stack_ffffffffffffff38);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(local_88,in_R8);
    setName(in_stack_ffffffffffffff90,(string *)in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(local_88);
  }
  return;
}

Assistant:

inline SessionWriter::SessionWriter(Session& session, std::size_t queueCapacity, std::uint64_t id, std::string name)
  :_session(& session),
   _channel(session.createChannel(queueCapacity)),
   _qw(_channel->queue())
{
  if (id != 0) { setId(id); }
  if (! name.empty()) { setName(std::move(name)); }
}